

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O1

bool __thiscall
perfetto::protos::gen::EnumDescriptorProto::operator==
          (EnumDescriptorProto *this,EnumDescriptorProto *other)

{
  size_t sVar1;
  EnumValueDescriptorProto *pEVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__first1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__last1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__first2;
  int iVar3;
  EnumValueDescriptorProto *other_00;
  EnumValueDescriptorProto *this_00;
  bool bVar4;
  
  sVar1 = (this->unknown_fields_)._M_string_length;
  if (((sVar1 == (other->unknown_fields_)._M_string_length) &&
      (((sVar1 == 0 ||
        (iVar3 = bcmp((this->unknown_fields_)._M_dataplus._M_p,
                      (other->unknown_fields_)._M_dataplus._M_p,sVar1), iVar3 == 0)) &&
       (sVar1 = (this->name_)._M_string_length, sVar1 == (other->name_)._M_string_length)))) &&
     ((sVar1 == 0 ||
      (iVar3 = bcmp((this->name_)._M_dataplus._M_p,(other->name_)._M_dataplus._M_p,sVar1),
      iVar3 == 0)))) {
    this_00 = (this->value_).
              super__Vector_base<perfetto::protos::gen::EnumValueDescriptorProto,_std::allocator<perfetto::protos::gen::EnumValueDescriptorProto>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pEVar2 = (this->value_).
             super__Vector_base<perfetto::protos::gen::EnumValueDescriptorProto,_std::allocator<perfetto::protos::gen::EnumValueDescriptorProto>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    other_00 = (other->value_).
               super__Vector_base<perfetto::protos::gen::EnumValueDescriptorProto,_std::allocator<perfetto::protos::gen::EnumValueDescriptorProto>_>
               ._M_impl.super__Vector_impl_data._M_start;
    if ((long)pEVar2 - (long)this_00 ==
        (long)(other->value_).
              super__Vector_base<perfetto::protos::gen::EnumValueDescriptorProto,_std::allocator<perfetto::protos::gen::EnumValueDescriptorProto>_>
              ._M_impl.super__Vector_impl_data._M_finish - (long)other_00) {
      bVar4 = this_00 == pEVar2;
      if (bVar4) {
LAB_00291f8f:
        if (bVar4) {
          __first1 = (this->reserved_name_).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          __last1 = (this->reserved_name_).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          __first2 = (other->reserved_name_).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          if ((long)__last1 - (long)__first1 ==
              (long)(other->reserved_name_).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)__first2) {
            bVar4 = ::std::__equal<false>::
                    equal<std::__cxx11::string_const*,std::__cxx11::string_const*>
                              (__first1,__last1,__first2);
            return bVar4;
          }
        }
      }
      else {
        bVar4 = EnumValueDescriptorProto::operator==(this_00,other_00);
        if (bVar4) {
          do {
            this_00 = this_00 + 1;
            other_00 = other_00 + 1;
            bVar4 = this_00 == pEVar2;
            if (bVar4) goto LAB_00291f8f;
            bVar4 = EnumValueDescriptorProto::operator==(this_00,other_00);
          } while (bVar4);
        }
      }
    }
  }
  return false;
}

Assistant:

T&& value() && {
    PERFETTO_CHECK(storage_.is_populated_);
    return std::move(storage_.value_);
  }